

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

void convert_32s_C4P4(OPJ_INT32 *pSrc,OPJ_INT32 **pDst,OPJ_SIZE_T length)

{
  OPJ_INT32 *pOVar1;
  OPJ_INT32 *pOVar2;
  OPJ_INT32 *pOVar3;
  OPJ_INT32 *pOVar4;
  OPJ_INT32 *pDst3;
  OPJ_INT32 *pDst2;
  OPJ_INT32 *pDst1;
  OPJ_INT32 *pDst0;
  OPJ_SIZE_T i;
  OPJ_SIZE_T length_local;
  OPJ_INT32 **pDst_local;
  OPJ_INT32 *pSrc_local;
  
  pOVar1 = *pDst;
  pOVar2 = pDst[1];
  pOVar3 = pDst[2];
  pOVar4 = pDst[3];
  for (pDst0 = (OPJ_INT32 *)0x0; pDst0 < length; pDst0 = (OPJ_INT32 *)((long)pDst0 + 1)) {
    pOVar1[(long)pDst0] = pSrc[(long)pDst0 * 4];
    pOVar2[(long)pDst0] = pSrc[(long)pDst0 * 4 + 1];
    pOVar3[(long)pDst0] = pSrc[(long)pDst0 * 4 + 2];
    pOVar4[(long)pDst0] = pSrc[(long)pDst0 * 4 + 3];
  }
  return;
}

Assistant:

static void convert_32s_C4P4(const OPJ_INT32* pSrc, OPJ_INT32* const* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	OPJ_INT32* pDst0 = pDst[0];
	OPJ_INT32* pDst1 = pDst[1];
	OPJ_INT32* pDst2 = pDst[2];
	OPJ_INT32* pDst3 = pDst[3];
	
	for (i = 0; i < length; i++) {
		pDst0[i] = pSrc[4*i+0];
		pDst1[i] = pSrc[4*i+1];
		pDst2[i] = pSrc[4*i+2];
		pDst3[i] = pSrc[4*i+3];
	}
}